

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void __thiscall
cs_impl::any::any<std::pair<cs_impl::any,cs_impl::any>>
          (any *this,pair<cs_impl::any,_cs_impl::any> *dat)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_0033ae80 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<cs::type_id>::allocator + DAT_0033ae80 * 8);
    DAT_0033ae80 = DAT_0033ae80 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_0032b020;
  ppVar2 = (dat->first).mDat;
  if (ppVar2 != (proxy *)0x0) {
    ppVar2->refcount = ppVar2->refcount + 1;
  }
  pbVar1[1]._vptr_baseHolder = (_func_int **)ppVar2;
  ppVar2 = (dat->second).mDat;
  if (ppVar2 != (proxy *)0x0) {
    ppVar2->refcount = ppVar2->refcount + 1;
  }
  pbVar1[2]._vptr_baseHolder = (_func_int **)ppVar2;
  if ((DAT_0033beb0 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_0033beb0];
    DAT_0033beb0 = DAT_0033beb0 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return;
}

Assistant:

any(const any &v) : mDat(v.duplicate()) {}